

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall PrintVisitor::visit(PrintVisitor *this,FunctionCallStatementNode *node)

{
  ExpressionNode *pEVar1;
  ostream *poVar2;
  PrintVisitor visitor;
  string local_40;
  
  poVar2 = this->stream_;
  indent_abi_cxx11_(&local_40,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  std::operator<<(poVar2,"FunctionCallStatementNode:\n");
  std::__cxx11::string::~string((string *)&local_40);
  local_40._M_string_length = (size_type)this->stream_;
  local_40.field_2._M_allocated_capacity._0_4_ = this->indentation_ + 1;
  local_40._M_dataplus._M_p = (pointer)&PTR__Visitor_00148d30;
  pEVar1 = (node->functionCall_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar1->super_Node)._vptr_Node + 0x10))(pEVar1,&local_40);
  return;
}

Assistant:

void PrintVisitor::visit(const FunctionCallStatementNode& node)
{
  stream_ << indent() << "FunctionCallStatementNode:\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  node.getFunctionCall().accept(visitor);
}